

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

char * fmt::v5::internal::
       format_decimal<char,unsigned_long,char*,fmt::v5::internal::add_thousands_sep<char>>
                 (char *out,unsigned_long value,int num_digits,add_thousands_sep<char> sep)

{
  char *pcVar1;
  assertion_failure *this;
  size_t __n;
  char_type buffer [26];
  
  if (-1 < num_digits) {
    pcVar1 = format_decimal<unsigned_long,char,fmt::v5::internal::add_thousands_sep<char>>
                       (buffer,value,num_digits,sep);
    __n = (long)pcVar1 - (long)buffer;
    if (__n != 0) {
      memcpy(out,buffer,__n);
    }
    return out + __n;
  }
  this = (assertion_failure *)__cxa_allocate_exception(0x10);
  assertion_failure::assertion_failure(this,"invalid digit count");
  __cxa_throw(this,&assertion_failure::typeinfo,std::logic_error::~logic_error);
}

Assistant:

inline Iterator format_decimal(
    Iterator out, UInt value, int num_digits, ThousandsSep sep) {
  FMT_ASSERT(num_digits >= 0, "invalid digit count");
  typedef typename ThousandsSep::char_type char_type;
  // Buffer should be large enough to hold all digits (<= digits10 + 1).
  enum { max_size = std::numeric_limits<UInt>::digits10 + 1 };
  FMT_ASSERT(ThousandsSep::size <= 1, "invalid separator");
  char_type buffer[max_size + max_size / 3];
  auto end = format_decimal(buffer, value, num_digits, sep);
  return internal::copy_str<OutChar>(buffer, end, out);
}